

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

ObjectData *
deqp::gles3::Performance::anon_unknown_0::Utils::variableQuad
          (ObjectData *__return_storage_ptr__,float depth)

{
  _Vector_base<float,_std::allocator<float>_> local_130;
  string local_118;
  string local_f8;
  ProgramSources local_d8;
  
  (anonymous_namespace)::Utils::getInstanceNoiseVertexShader_abi_cxx11_();
  (anonymous_namespace)::Utils::getDepthAsRedFragmentShader_abi_cxx11_();
  glu::makeVtxFragSources(&local_d8,&local_f8,&local_118);
  getFullscreenQuad((vector<float,_std::allocator<float>_> *)&local_130,0.8);
  ObjectData::ObjectData(__return_storage_ptr__,&local_d8,(Geometry *)&local_130);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_130);
  glu::ProgramSources::~ProgramSources(&local_d8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  return __return_storage_ptr__;
}

Assistant:

inline ObjectData variableQuad (float depth)
	{
		return ObjectData(glu::makeVtxFragSources(getInstanceNoiseVertexShader(), getDepthAsRedFragmentShader()), getFullscreenQuad(depth));
	}